

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

void __thiscall Js::ProbeContainer::Close(ProbeContainer *this)

{
  ScriptContext *pSVar1;
  DebugManager *pDVar2;
  
  pSVar1 = this->pScriptContext;
  if (pSVar1 == (ScriptContext *)0x0) {
    pDVar2 = (DebugManager *)0x0;
  }
  else {
    pDVar2 = pSVar1->threadContext->debugManager;
  }
  this->debugManager = pDVar2;
  if ((pDVar2 != (DebugManager *)0x0) && ((pDVar2->stepController).pActivatedContext == pSVar1)) {
    StepController::Deactivate(&pDVar2->stepController,(InterpreterHaltState *)0x0);
  }
  this->pScriptContext = (ScriptContext *)0x0;
  this->debugManager = (DebugManager *)0x0;
  return;
}

Assistant:

void ProbeContainer::Close()
    {
        // Probe manager instance may go down early.
        if (this->pScriptContext)
        {
            debugManager = this->pScriptContext->GetThreadContext()->GetDebugManager();
        }
        else
        {
            debugManager = nullptr;
        }
        if (debugManager != nullptr && debugManager->stepController.pActivatedContext == pScriptContext)
        {
            debugManager->stepController.Deactivate();
        }
#ifdef ENABLE_MUTATION_BREAKPOINT
        this->RemoveMutationBreakpointListIfNeeded();
#endif
        pScriptContext = nullptr;
        debugManager = nullptr;
    }